

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O0

int do_hmac_prov(int iter,EVP_MD *md,char *plaintext,hash_testvec *t)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  uint in_EDI;
  OSSL_PARAM params [2];
  EVP_MAC_CTX *ctx;
  EVP_MAC *hmac;
  uchar out [64];
  size_t len;
  char *local_c8;
  undefined4 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  size_t len_00;
  void *in_stack_ffffffffffffff60;
  undefined1 local_68 [64];
  size_t local_28;
  long local_20;
  undefined8 local_18;
  undefined8 local_10;
  uint local_8;
  uint local_4;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (in_EDI == 0) {
    printf("[HMAC by EVP_MAC] ");
  }
  lVar2 = EVP_MAC_fetch(0);
  if (lVar2 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("hmac = EVP_MAC_fetch(NULL, \"HMAC\", NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x21a);
  }
  lVar3 = EVP_MAC_CTX_new(lVar2);
  if (lVar3 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_MAC_CTX_new(hmac)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x21c);
  }
  local_c8 = "digest";
  local_c0 = 4;
  local_b8 = EVP_MD_get0_name(local_10);
  local_b0 = 0;
  len_00 = 0xffffffffffffffff;
  memset(&stack0xffffffffffffff60,0,0x28);
  iVar1 = EVP_MAC_init(lVar3,*(undefined8 *)(local_20 + 0x28),(long)*(int *)(local_20 + 0x44),
                       &local_c8);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x222);
  }
  iVar1 = EVP_MAC_update(lVar3,local_18,(long)*(int *)(local_20 + 0x30));
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x223);
  }
  iVar1 = EVP_MAC_final(lVar3,local_68,&local_28,0x40);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x224);
  }
  EVP_MAC_CTX_free(lVar3);
  EVP_MAC_free(lVar2);
  if ((*(long *)(local_20 + 0x38) != 0) && (local_28 != *(size_t *)(local_20 + 0x38))) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("len == t->outsize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x229);
  }
  iVar1 = memcmp(local_68,*(void **)(local_20 + 0x20),local_28);
  if (iVar1 != 0) {
    printf("\x1b[1;31mhmac mismatch (iter %d)\x1b[m\n",(ulong)local_8);
    hexdump(in_stack_ffffffffffffff60,len_00);
    hexdump(in_stack_ffffffffffffff60,len_00);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int do_hmac_prov(int iter, const EVP_MD *md, const char *plaintext,
    const struct hash_testvec *t)
{
    size_t len;
    unsigned char out[EVP_MAX_MD_SIZE];
    if (!iter)
	printf("[HMAC by EVP_MAC] ");

    EVP_MAC *hmac;
    T(hmac = EVP_MAC_fetch(NULL, "HMAC", NULL));
    EVP_MAC_CTX *ctx;
    T(ctx = EVP_MAC_CTX_new(hmac));
    OSSL_PARAM params[] = {
	OSSL_PARAM_utf8_string(OSSL_MAC_PARAM_DIGEST,
	    (char *)EVP_MD_name(md), 0),
	OSSL_PARAM_END
    };
    T(EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params));
    T(EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize));
    T(EVP_MAC_final(ctx, out, &len, sizeof(out)));
    EVP_MAC_CTX_free(ctx);
    EVP_MAC_free(hmac);

    if (t->outsize)
	T(len == t->outsize);
    if (memcmp(out, t->hmac, len) != 0) {
	printf(cRED "hmac mismatch (iter %d)" cNORM "\n", iter);
	hexdump(t->hmac, len);
	hexdump(out, len);
	return 1;
    }
    return 0;
}